

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O0

void bifpty(bifcxdef *ctx,int argc)

{
  long lVar1;
  uint typ;
  uint uVar2;
  uint uVar3;
  uchar *puVar4;
  long in_RDI;
  prpdef *propptr;
  objdef *objptr;
  objnum orn;
  runsdef val;
  uint ofs;
  objnum objn;
  prpnum prpn;
  int in_stack_ffffffffffffffac;
  mcmon obj;
  runcxdef *in_stack_ffffffffffffffb0;
  runcxdef *in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  objnum *in_stack_ffffffffffffffd0;
  prpnum in_stack_ffffffffffffffdc;
  objnum in_stack_ffffffffffffffde;
  mcmcxdef *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(*(long *)(in_RDI + 8) + 0x20);
  *(long *)(*(long *)(in_RDI + 8) + 0x20) = lVar1 + -0x10;
  if (*(char *)(lVar1 + -0x10) != '\x02') {
    *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 0;
    runsign(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  }
  typ = (uint)*(ushort *)(*(long *)(*(long *)(in_RDI + 8) + 0x20) + 8);
  lVar1 = *(long *)(*(long *)(in_RDI + 8) + 0x20);
  *(long *)(*(long *)(in_RDI + 8) + 0x20) = lVar1 + -0x10;
  if (*(char *)(lVar1 + -0x10) == '\r') {
    uVar2 = (uint)*(ushort *)(*(long *)(*(long *)(in_RDI + 8) + 0x20) + 8);
    uVar3 = objgetap(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffde,in_stack_ffffffffffffffdc,
                     in_stack_ffffffffffffffd0,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
    obj = (mcmon)((uint)in_stack_ffffffffffffffac >> 0x10);
    if (uVar3 != 0) {
      puVar4 = mcmlck((mcmcxdef *)CONCAT44(typ,uVar2),
                      (mcmon)((ulong)in_stack_ffffffffffffffb0 >> 0x30));
      if (uVar3 == 0) {
        in_stack_ffffffffffffffb0 = (runcxdef *)0x0;
      }
      else {
        in_stack_ffffffffffffffb0 = (runcxdef *)(puVar4 + uVar3);
      }
      in_stack_ffffffffffffffc0 = in_stack_ffffffffffffffb0;
      mcmunlck((mcmcxdef *)in_stack_ffffffffffffffb0,obj);
    }
    runpush(in_stack_ffffffffffffffc0,typ,(runsdef *)in_stack_ffffffffffffffb0);
    return;
  }
  *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 0;
  runsign(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
}

Assistant:

void bifpty(bifcxdef *ctx, int argc)
{
    prpnum   prpn;
    objnum   objn;
    uint     ofs;
    runsdef  val;
    objnum   orn;
    objdef  *objptr;
    prpdef  *propptr;

    bifcntargs(ctx, 2, argc);
    
    /* get offset of obj.prop */
    objn = runpopobj(ctx->bifcxrun);
    prpn = runpopprp(ctx->bifcxrun);
    ofs = objgetap(ctx->bifcxrun->runcxmem, objn, prpn, &orn, FALSE);
    
    if (ofs)
    {
        /* lock the object, read the prpdef, and unlock it */
        objptr = (objdef *)mcmlck(ctx->bifcxrun->runcxmem, (mcmon)orn);
        propptr = objofsp(objptr, ofs);
        val.runsv.runsvnum = prptype(propptr);
        mcmunlck(ctx->bifcxrun->runcxmem, (mcmon)orn);
    }
    else
    {
        /* property is not defined by object - indicate that type is nil */
        val.runsv.runsvnum = DAT_NIL;
    }
    
    /* special case:  DAT_DEMAND -> DAT_LIST (for contents properties) */
    if (val.runsv.runsvnum == DAT_DEMAND)
        val.runsv.runsvnum = DAT_LIST;

    /* return the property type as a number */
    runpush(ctx->bifcxrun, DAT_NUMBER, &val);
}